

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_execution_path(plugin p,loader_impl impl,char *path)

{
  int iVar1;
  void *pvVar2;
  set_value pvVar3;
  vector pvVar4;
  set_key in_RDX;
  set in_RSI;
  plugin in_RDI;
  vector paths;
  loader_impl_interface iface;
  void *in_stack_ffffffffffffffb8;
  vector in_stack_ffffffffffffffc0;
  set_key in_stack_ffffffffffffffd0;
  set in_stack_ffffffffffffffd8;
  
  if (in_RSI != (set)0x0) {
    if ((int)in_RSI->capacity != 0) {
      plugin_name(in_RDI);
      pvVar3 = set_get(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      if (pvVar3 == (set_value)0x0) {
        pvVar4 = vector_create(0x130750);
        if (pvVar4 == (vector)0x0) {
          return 1;
        }
        in_stack_ffffffffffffffc0 = (vector)in_RSI[1].buckets;
        plugin_name(in_RDI);
        iVar1 = set_insert(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
        if (iVar1 != 0) {
          vector_destroy((vector)0x1307a0);
          return 1;
        }
      }
      vector_push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      return 0;
    }
    pvVar2 = plugin_iface(in_RDI);
    if (pvVar2 != (void *)0x0) {
      iVar1 = (**(code **)((long)pvVar2 + 8))(in_RSI,in_RDX);
      return iVar1;
    }
  }
  return 1;
}

Assistant:

int loader_impl_execution_path(plugin p, loader_impl impl, const loader_path path)
{
	if (impl != NULL)
	{
		if (impl->init == 0)
		{
			/* If loader is initialized, load the execution path */
			loader_impl_interface iface = loader_iface(p);

			if (iface != NULL)
			{
				return iface->execution_path(impl, path);
			}
		}
		else
		{
			/* If loader is not initialized, store the execution path for later use */
			vector paths = set_get(impl->exec_path_map, (const set_key)plugin_name(p));

			if (paths == NULL)
			{
				paths = vector_create(sizeof(char) * LOADER_PATH_SIZE);

				if (paths == NULL)
				{
					return 1;
				}

				if (set_insert(impl->exec_path_map, (set_key)plugin_name(p), paths) != 0)
				{
					vector_destroy(paths);

					return 1;
				}
			}

			vector_push_back(paths, (void *)path);

			return 0;
		}
	}

	return 1;
}